

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_viewer.c
# Opt level: O0

int oonf_viewer_call_subcommands
              (autobuf *out,abuf_template_storage *storage,char *param,
              oonf_viewer_template *templates,size_t count)

{
  bool bVar1;
  char *pcVar2;
  _Bool local_5c;
  _Bool local_5b;
  _Bool local_5a;
  _Bool data;
  _Bool raw;
  _Bool json;
  ulong uStack_58;
  _Bool head;
  size_t i;
  int result;
  char *ptr;
  char *next;
  size_t count_local;
  oonf_viewer_template *templates_local;
  char *param_local;
  abuf_template_storage *storage_local;
  autobuf *out_local;
  
  i._4_4_ = 0;
  bVar1 = false;
  local_5a = false;
  local_5b = false;
  local_5c = false;
  ptr = str_hasnextword(param,"head");
  if (ptr == (char *)0x0) {
    ptr = str_hasnextword(param,"json");
    if (ptr == (char *)0x0) {
      ptr = str_hasnextword(param,"raw");
      if (ptr == (char *)0x0) {
        ptr = str_hasnextword(param,"jsonraw");
        if (ptr == (char *)0x0) {
          ptr = str_hasnextword(param,"data");
          if (ptr == (char *)0x0) {
            pcVar2 = str_hasnextword(param,"dataraw");
            local_5c = pcVar2 != (char *)0x0;
            local_5b = local_5c;
            local_5a = local_5c;
            ptr = param;
            if (local_5c) {
              ptr = pcVar2;
            }
          }
          else {
            local_5a = true;
            local_5c = true;
          }
        }
        else {
          local_5a = true;
          local_5b = true;
        }
      }
      else {
        local_5b = true;
      }
    }
    else {
      local_5a = true;
    }
  }
  else {
    bVar1 = true;
  }
  uStack_58 = 0;
  while( true ) {
    if (count <= uStack_58) {
      return 1;
    }
    pcVar2 = str_hasnextword(ptr,templates[uStack_58].json_name);
    if (pcVar2 != (char *)0x0) break;
    uStack_58 = uStack_58 + 1;
  }
  templates[uStack_58].create_json = local_5a;
  templates[uStack_58].create_raw = local_5b;
  templates[uStack_58].create_only_data = local_5c;
  oonf_viewer_output_prepare(templates + uStack_58,storage,out,pcVar2);
  if (bVar1) {
    abuf_add_template(out,templates[uStack_58]._storage,true);
    abuf_puts(out,"\n");
  }
  else {
    i._4_4_ = (*templates[uStack_58].cb_function)(templates + uStack_58);
  }
  oonf_viewer_output_finish(templates + uStack_58);
  return i._4_4_;
}

Assistant:

int
oonf_viewer_call_subcommands(struct autobuf *out, struct abuf_template_storage *storage, const char *param,
  struct oonf_viewer_template *templates, size_t count) {
  const char *next = NULL, *ptr = NULL;
  int result = 0;
  size_t i;
  bool head = false;
  bool json = false;
  bool raw = false;
  bool data = false;

  if ((next = str_hasnextword(param, OONF_VIEWER_HEAD_FORMAT))) {
    head = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_JSON_FORMAT))) {
    json = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_RAW_FORMAT))) {
    raw = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_JSON_RAW_FORMAT))) {
    json = true;
    raw = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_DATA_FORMAT))) {
    json = true;
    data = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_DATA_RAW_FORMAT))) {
    json = true;
    raw = true;
    data = true;
  }
  else {
    next = param;
  }

  for (i = 0; i < count; i++) {
    if ((ptr = str_hasnextword(next, templates[i].json_name))) {
      templates[i].create_json = json;
      templates[i].create_raw = raw;
      templates[i].create_only_data = data;

      oonf_viewer_output_prepare(&templates[i], storage, out, ptr);

      if (head) {
        abuf_add_template(out, templates[i]._storage, true);
        abuf_puts(out, "\n");
      }
      else {
        result = templates[i].cb_function(&templates[i]);
      }

      oonf_viewer_output_finish(&templates[i]);

      return result;
    }
  }
  return 1;
}